

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BrAddWrongLocalNwkDataFail_Test::TestBody
          (InterpreterTestSuite_PC_BrAddWrongLocalNwkDataFail_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_7f0;
  AssertHelper local_7d0;
  Message local_7c8;
  bool local_7b9;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar__3;
  allocator local_759;
  string local_758;
  Expression local_738;
  AssertHelper local_720;
  Message local_718;
  Error local_710;
  allocator local_6e1;
  string local_6e0;
  Error local_6c0;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_668;
  Message local_660;
  bool local_651;
  undefined1 local_650 [8];
  AssertionResult gtest_ar__2;
  allocator local_5f1;
  string local_5f0;
  Expression local_5d0;
  AssertHelper local_5b8;
  Message local_5b0;
  Error local_5a8;
  allocator local_579;
  string local_578;
  Error local_558;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__1;
  allocator local_489;
  string local_488;
  Expression local_468;
  AssertHelper local_450;
  Message local_448;
  Error local_440;
  allocator local_411;
  string local_410;
  Error local_3f0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_398;
  Message local_390;
  bool local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_;
  allocator local_321;
  string local_320;
  Expression local_300;
  AssertHelper local_2e8;
  Message local_2e0;
  Error local_2d8;
  allocator local_2a9;
  string local_2a8;
  Error local_288;
  undefined1 local_260 [8];
  AssertionResult gtest_ar;
  Value value;
  Expression expr;
  undefined1 local_1e8 [8];
  string brJsonDomainNameZeroXPan;
  undefined1 local_1c0 [8];
  string brJsonNwkNameZeroXPan;
  undefined1 local_198 [8];
  string brJsonDomainName;
  undefined1 local_170 [8];
  string brJsonNwkName;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_BrAddWrongLocalNwkDataFail_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_170,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n    }\n]"
             ,(allocator *)(brJsonDomainName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(brJsonDomainName.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_198,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"DomainName\": \"dom1\"\n    }\nn]"
             ,(allocator *)(brJsonNwkNameZeroXPan.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(brJsonNwkNameZeroXPan.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1c0,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n        \"ExtendedPanId\": 0,\n    }\n]"
             ,(allocator *)(brJsonDomainNameZeroXPan.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(brJsonDomainNameZeroXPan.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1e8,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n        \"ExtendedPanId\": 0,\n        \"DomainName\": \"dom1\"\n    }\n]"
             ,(allocator *)
              ((long)&expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"./tmp/json.json",&local_2a9);
  ot::commissioner::WriteFile(&local_288,(string *)local_170,&local_2a8);
  ot::commissioner::Error::Error(&local_2d8);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_260,"WriteFile(brJsonNwkName, \"./tmp/json.json\")","Error{}",
             &local_288,&local_2d8);
  ot::commissioner::Error::~Error(&local_2d8);
  ot::commissioner::Error::~Error(&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x93d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"br add ./tmp/json.json",&local_321);
  ot::commissioner::Interpreter::ParseExpression(&local_300,(Interpreter *)local_140,&local_320);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=
            ((Value *)&gtest_ar.message_,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar.message_);
  local_381 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_380,&local_381,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar2) {
    testing::Message::Message(&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_380,(AssertionResult *)0x46a487,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x940,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"./tmp/json.json",&local_411);
  ot::commissioner::WriteFile(&local_3f0,(string *)local_1c0,&local_410);
  ot::commissioner::Error::Error(&local_440);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_3c8,"WriteFile(brJsonNwkNameZeroXPan, \"./tmp/json.json\")","Error{}"
             ,&local_3f0,&local_440);
  ot::commissioner::Error::~Error(&local_440);
  ot::commissioner::Error::~Error(&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar2) {
    testing::Message::Message(&local_448);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x942,pcVar3);
    testing::internal::AssertHelper::operator=(&local_450,&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_488,"br add ./tmp/json.json",&local_489);
  ot::commissioner::Interpreter::ParseExpression(&local_468,(Interpreter *)local_140,&local_488);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_468);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=
            ((Value *)&gtest_ar.message_,(Value *)&gtest_ar__1.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar.message_);
  local_4e9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar2) {
    testing::Message::Message(&local_4f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_4e8,(AssertionResult *)0x46a487,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x945,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"./tmp/json.json",&local_579);
  ot::commissioner::WriteFile(&local_558,(string *)local_198,&local_578);
  ot::commissioner::Error::Error(&local_5a8);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_530,"WriteFile(brJsonDomainName, \"./tmp/json.json\")","Error{}",
             &local_558,&local_5a8);
  ot::commissioner::Error::~Error(&local_5a8);
  ot::commissioner::Error::~Error(&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar2) {
    testing::Message::Message(&local_5b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x947,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    testing::Message::~Message(&local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0,"br add ./tmp/json.json",&local_5f1);
  ot::commissioner::Interpreter::ParseExpression(&local_5d0,(Interpreter *)local_140,&local_5f0);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_5d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__2.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=
            ((Value *)&gtest_ar.message_,(Value *)&gtest_ar__2.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__2.message_);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar.message_);
  local_651 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_650,&local_651,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar2) {
    testing::Message::Message(&local_660);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_650,(AssertionResult *)0x46a487,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x94a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_668,&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e0,"./tmp/json.json",&local_6e1);
  ot::commissioner::WriteFile(&local_6c0,(string *)local_1e8,&local_6e0);
  ot::commissioner::Error::Error(&local_710);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_698,"WriteFile(brJsonDomainNameZeroXPan, \"./tmp/json.json\")",
             "Error{}",&local_6c0,&local_710);
  ot::commissioner::Error::~Error(&local_710);
  ot::commissioner::Error::~Error(&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar2) {
    testing::Message::Message(&local_718);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x94c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_758,"br add ./tmp/json.json",&local_759);
  ot::commissioner::Interpreter::ParseExpression(&local_738,(Interpreter *)local_140,&local_758);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_738);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__3.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=
            ((Value *)&gtest_ar.message_,(Value *)&gtest_ar__3.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__3.message_);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar.message_);
  local_7b9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7b8,&local_7b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar2) {
    testing::Message::Message(&local_7c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7f0,(internal *)local_7b8,(AssertionResult *)0x46a487,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x94f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    std::__cxx11::string::~string((string *)&local_7f0);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_170);
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrAddWrongLocalNwkDataFail)
{
    TestContext ctx;
    InitContext(ctx);

    std::string brJsonNwkName            = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
    }\n\
]";
    std::string brJsonDomainName         = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"DomainName\": \"dom1\"\n\
    }\n\
n]";
    std::string brJsonNwkNameZeroXPan    = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
        \"ExtendedPanId\": 0,\n\
    }\n\
]";
    std::string brJsonDomainNameZeroXPan = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
        \"ExtendedPanId\": 0,\n\
        \"DomainName\": \"dom1\"\n\
    }\n\
]";

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_EQ(WriteFile(brJsonNwkName, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonNwkNameZeroXPan, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonDomainName, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonDomainNameZeroXPan, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}